

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plt-elf.c
# Opt level: O3

undefined1 * plt_get_real_fn(plt_ctx ctx,char *name)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint *puVar5;
  uint *puVar6;
  Elf64_Sxword *pEVar7;
  uint uVar8;
  int iVar9;
  Elf64_Dyn *pEVar10;
  Elf64_Addr base;
  byte *pbVar11;
  long lVar12;
  ulong uVar13;
  uint *puVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  Elf64_Dyn *pEVar18;
  Elf64_Dyn *pEVar19;
  uint *puVar20;
  uint *puVar21;
  link_map *plVar22;
  uint uVar23;
  
  plVar22 = ctx->r_map;
  if (plVar22 == (link_map *)0x0) {
    return (undefined1 *)0x0;
  }
  do {
    lVar12 = plVar22->l_ld->d_tag;
    if (lVar12 != 0) {
      puVar5 = (uint *)plVar22->l_addr;
      pEVar10 = plVar22->l_ld + 1;
      lVar16 = lVar12;
      pEVar19 = pEVar10;
      do {
        lVar15 = lVar12;
        pEVar18 = pEVar10;
        if (lVar16 == 6) {
          puVar21 = (uint *)pEVar19[-1].d_un.d_val;
          if ((uint *)0xfeffffffffffffff < puVar21 || puVar21 < puVar5) {
            puVar21 = (uint *)((long)puVar21 + (long)puVar5);
          }
          goto LAB_001083a7;
        }
        lVar16 = pEVar19->d_tag;
        pEVar19 = pEVar19 + 1;
      } while (lVar16 != 0);
      puVar21 = (uint *)0x0;
LAB_001083a7:
      do {
        if (lVar15 == 5) {
          puVar6 = (uint *)pEVar18[-1].d_un.d_val;
          puVar14 = puVar6;
          if ((uint *)0xfeffffffffffffff < puVar6) {
            puVar14 = (uint *)((long)puVar5 + (long)puVar6);
          }
          if (puVar6 < puVar5) {
            puVar14 = (uint *)((long)puVar5 + (long)puVar6);
          }
          if ((puVar21 != (uint *)0x0) &&
             (lVar16 = lVar12, pEVar19 = pEVar10, puVar14 != (uint *)0x0)) goto LAB_001083fe;
          break;
        }
        pEVar7 = &pEVar18->d_tag;
        lVar15 = *pEVar7;
        pEVar18 = pEVar18 + 1;
      } while (*pEVar7 != 0);
    }
LAB_001085fa:
    plVar22 = plVar22->l_next;
    if (plVar22 == (link_map *)0x0) {
      return (undefined1 *)0x0;
    }
  } while( true );
LAB_001083fe:
  if (lVar16 != 0x6ffffef5) goto code_r0x00108407;
  puVar6 = (uint *)pEVar19[-1].d_un.d_val;
  puVar20 = puVar6;
  if ((uint *)0xfeffffffffffffff < puVar6) {
    puVar20 = (uint *)((long)puVar5 + (long)puVar6);
  }
  if (puVar6 < puVar5) {
    puVar20 = (uint *)((long)puVar5 + (long)puVar6);
  }
  if (puVar20 != (uint *)0x0) {
    uVar13 = 0x1505;
    bVar1 = *name;
    pbVar11 = (byte *)(name + 1);
    while (uVar8 = (uint)uVar13, bVar1 != 0) {
      uVar13 = (ulong)((uint)bVar1 + uVar8 * 0x21);
      bVar1 = *pbVar11;
      pbVar11 = pbVar11 + 1;
    }
    uVar17 = (ulong)puVar20[2];
    if (((*(ulong *)(puVar20 + ((uVar13 >> 6) % uVar17) * 2 + 4) >> (uVar13 & 0x3f) & 1) != 0) &&
       ((*(ulong *)(puVar20 + ((uVar13 >> 6) % uVar17) * 2 + 4) >>
         ((ulong)(uVar8 >> ((byte)puVar20[3] & 0x1f)) & 0x3f) & 1) != 0)) {
      uVar4 = *puVar20;
      uVar23 = puVar20[uVar17 * 2 + uVar13 % (ulong)uVar4 + 4];
      uVar2 = puVar20[1];
      while (uVar3 = puVar20[uVar17 * 2 + (ulong)uVar4 + (ulong)(uVar23 - uVar2) + 4],
            1 < (uVar3 ^ uVar8)) {
LAB_00108511:
        uVar23 = uVar23 + 1;
        if ((uVar3 & 1) != 0) goto LAB_001085fa;
      }
      uVar13 = (ulong)uVar23;
      iVar9 = strcmp((char *)((ulong)puVar21[uVar13 * 6] + (long)puVar14),name);
      if (iVar9 != 0) goto LAB_00108511;
      goto LAB_001085f3;
    }
    goto LAB_001085fa;
  }
  goto LAB_0010851f;
code_r0x00108407:
  lVar16 = pEVar19->d_tag;
  pEVar19 = pEVar19 + 1;
  if (lVar16 == 0) goto LAB_0010851f;
  goto LAB_001083fe;
LAB_0010851f:
  if (lVar12 != 4) goto code_r0x00108525;
  puVar6 = (uint *)pEVar10[-1].d_un.d_val;
  puVar20 = puVar6;
  if ((uint *)0xfeffffffffffffff < puVar6) {
    puVar20 = (uint *)((long)puVar5 + (long)puVar6);
  }
  if (puVar6 < puVar5) {
    puVar20 = (uint *)((long)puVar5 + (long)puVar6);
  }
  if (puVar20 != (uint *)0x0) {
    bVar1 = *name;
    if (bVar1 == 0) {
      uVar13 = 0;
    }
    else {
      uVar13 = 0;
      pbVar11 = (byte *)(name + 1);
      do {
        uVar13 = (ulong)bVar1 + uVar13 * 0x10;
        uVar8 = (uint)uVar13 & 0xf0000000;
        uVar13 = ~(ulong)uVar8 & (uVar8 >> 0x18 ^ uVar13);
        bVar1 = *pbVar11;
        pbVar11 = pbVar11 + 1;
      } while (bVar1 != 0);
    }
    uVar8 = *puVar20;
    uVar4 = puVar20[uVar13 % (ulong)uVar8 + 2];
    if (uVar4 != 0) {
      while( true ) {
        uVar13 = (ulong)uVar4;
        iVar9 = mmk_streq((char *)((ulong)puVar21[uVar13 * 6] + (long)puVar14),name);
        if (iVar9 != 0) break;
        uVar4 = puVar20[(ulong)uVar8 + uVar13 + 2];
        if (uVar4 == 0) goto LAB_001085fa;
      }
LAB_001085f3:
      if (*(long *)(puVar21 + uVar13 * 6 + 4) != 0) {
        return (undefined1 *)(plVar22->l_addr + *(long *)(puVar21 + uVar13 * 6 + 2));
      }
    }
  }
  goto LAB_001085fa;
code_r0x00108525:
  lVar12 = pEVar10->d_tag;
  pEVar10 = pEVar10 + 1;
  if (lVar12 == 0) goto LAB_001085fa;
  goto LAB_0010851f;
}

Assistant:

plt_fn *plt_get_real_fn(plt_ctx ctx, const char *name)
{
    for (struct link_map *lm = ctx->r_map; lm != NULL; lm = lm->l_next) {
        ElfW(Sym) *sym = sym_lookup_dyn(lm, name);
        if (sym) {
            /* Some compilers (e.g. ICC) put unresolved symbols into the
               symbol table with a size of 0. We ignore them to avoid
               getting the address of the PLT stub. */
            if (sym->st_size == 0)
                continue;

            return (void *) (sym->st_value + lm->l_addr);
        }
    }
    return NULL;
}